

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

FeatureSet *
google::protobuf::descriptor_unittest::GetCoreFeatures<google::protobuf::MethodDescriptor>
          (FeatureSet *__return_storage_ptr__,MethodDescriptor *descriptor)

{
  anon_union_64_1_493b367e_for_FeatureSet_53 *this;
  
  FeatureSet::FeatureSet(__return_storage_ptr__,(Arena *)0x0,descriptor->merged_features_);
  this = &__return_storage_ptr__->field_0;
  protobuf::internal::ExtensionSet::ClearExtension(&(this->_impl_)._extensions_,pb::test);
  protobuf::internal::ExtensionSet::ClearExtension
            (&(this->_impl_)._extensions_,pb::TestMessage::test_message);
  protobuf::internal::ExtensionSet::ClearExtension
            (&(this->_impl_)._extensions_,pb::TestMessage_Nested::test_nested);
  return __return_storage_ptr__;
}

Assistant:

FeatureSet GetCoreFeatures(const T* descriptor) {
  FeatureSet features = GetFeatures(descriptor);
  // Strip test features to avoid excessive brittleness.
  features.ClearExtension(pb::test);
  features.ClearExtension(pb::TestMessage::test_message);
  features.ClearExtension(pb::TestMessage::Nested::test_nested);
  return features;
}